

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

HandlePtr dg::vr::RelationsAnalyzer::getHandleFromFroms
                    (ValueRelations *toRels,ValueRelations *fromRels,V val)

{
  HandlePtr pBVar1;
  HandlePtr to;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> froms;
  V in_stack_00000050;
  ValueRelations *in_stack_00000058;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *in_stack_ffffffffffffffd0;
  ValueRelations *in_stack_ffffffffffffffd8;
  
  getFroms(in_stack_00000058,in_stack_00000050);
  pBVar1 = getHandleFromFroms(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::~vector
            (in_stack_ffffffffffffffd0);
  return pBVar1;
}

Assistant:

RelationsAnalyzer::HandlePtr
RelationsAnalyzer::getHandleFromFroms(const ValueRelations &toRels,
                                      const ValueRelations &fromRels, V val) {
    auto froms = getFroms(fromRels, val);
    auto to = getHandleFromFroms(toRels, froms);
    return to;
}